

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_neg_32_ai(void)

{
  uint address;
  uint uVar1;
  uint res;
  uint src;
  uint ea;
  
  address = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  uVar1 = m68ki_read_32_fc(address,m68ki_cpu.s_flag | m68ki_address_space);
  m68ki_cpu.not_z_flag = -uVar1;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
  m68ki_cpu.x_flag = (uVar1 & m68ki_cpu.not_z_flag | uVar1 | m68ki_cpu.not_z_flag) >> 0x17;
  m68ki_cpu.v_flag = (uVar1 & m68ki_cpu.not_z_flag) >> 0x18;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_32_fc(address,m68ki_cpu.s_flag | 1,m68ki_cpu.not_z_flag);
  return;
}

Assistant:

static void m68k_op_neg_32_ai(void)
{
	uint ea = EA_AY_AI_32();
	uint src = m68ki_read_32(ea);
	uint res = 0 - src;

	FLAG_N = NFLAG_32(res);
	FLAG_C = FLAG_X = CFLAG_SUB_32(src, 0, res);
	FLAG_V = (src & res)>>24;
	FLAG_Z = MASK_OUT_ABOVE_32(res);

	m68ki_write_32(ea, FLAG_Z);
}